

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_bases.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::ZeroFieldsBase::InternalSwap(ZeroFieldsBase *this,ZeroFieldsBase *other)

{
  UnknownFieldSet *other_00;
  InternalMetadata *this_00;
  
  this_00 = &(other->super_Message).super_MessageLite._internal_metadata_;
  if ((((this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) == 0) &&
     ((this_00->ptr_ & 1) == 0)) {
    return;
  }
  if ((this_00->ptr_ & 1U) == 0) {
    other_00 = InternalMetadata::mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>
                         (this_00);
  }
  else {
    other_00 = (UnknownFieldSet *)((this_00->ptr_ & 0xfffffffffffffffeU) + 8);
  }
  InternalMetadata::DoSwap<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_,other_00);
  return;
}

Assistant:

void ZeroFieldsBase::InternalSwap(ZeroFieldsBase* other) {
  _internal_metadata_.Swap<UnknownFieldSet>(&other->_internal_metadata_);
}